

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall
duckdb_re2::Prog::ConfigurePrefixAccel(Prog *this,string *prefix,bool prefix_foldcase)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  int b;
  long lVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  uint64_t *__s;
  ulong uVar6;
  undefined7 in_register_00000011;
  iterator __begin2;
  byte *pbVar7;
  ulong uVar8;
  ushort *puVar9;
  ulong uVar10;
  size_t dcurr;
  undefined8 uStack_280;
  ushort local_278 [16];
  byte *local_258;
  ulong local_250;
  uint16_t nfa [256];
  
  this->prefix_foldcase_ = prefix_foldcase;
  uVar6 = prefix->_M_string_length;
  this->prefix_size_ = uVar6;
  if ((int)CONCAT71(in_register_00000011,prefix_foldcase) == 0) {
    *(int *)&this->field_11 = (int)*(prefix->_M_dataplus)._M_p;
    if (uVar6 != 1) {
      *(int *)((long)&this->field_11 + 4) =
           (int)(prefix->_M_dataplus)._M_p[prefix->_M_string_length - 1];
    }
  }
  else {
    if (8 < uVar6) {
      uVar6 = 9;
    }
    this->prefix_size_ = uVar6;
    uVar10 = 0;
    uStack_280 = 0x41caf9;
    std::__cxx11::string::substr((ulong)&local_258,(ulong)prefix);
    uVar6 = local_250;
    uStack_280 = 0x41cb0e;
    memset(nfa,0,0x200);
    pbVar7 = local_258;
    while (uVar6 != uVar10) {
      pbVar1 = local_258 + uVar10;
      uVar10 = uVar10 + 1;
      nfa[*pbVar1] = nfa[*pbVar1] | (ushort)(1 << ((byte)uVar10 & 0x1f));
    }
    for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
      *(byte *)(nfa + lVar4) = (byte)nfa[lVar4] | 1;
    }
    local_278[4] = 0;
    local_278[5] = 0;
    local_278[6] = 0;
    local_278[7] = 0;
    local_278[8] = 0;
    local_278[9] = 0;
    local_278[0] = 1;
    local_278[1] = 0;
    local_278[2] = 0;
    local_278[3] = 0;
    for (uVar10 = 1; uVar10 - uVar6 != 1; uVar10 = uVar10 + 1) {
      uVar8 = uVar10;
      if (uVar10 == uVar6) {
        uVar8 = 9;
      }
      local_278[uVar8] =
           *(short *)((long)&uStack_280 + uVar10 * 2 + 6) * 2 + 1U & nfa[pbVar7[uVar10 - 1]];
    }
    uStack_280 = 0x41cbc4;
    std::
    __sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
              (pbVar7,pbVar7 + uVar6);
    uStack_280 = 0x41cbd6;
    _Var5 = std::
            __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_258,local_258 + local_250);
    uStack_280 = 0x41cbea;
    std::__cxx11::string::erase(&local_258,_Var5._M_current,local_258 + local_250);
    uStack_280 = 0x41cbf4;
    __s = (uint64_t *)operator_new__(0x800);
    uStack_280 = 0x41cc09;
    memset(__s,0,0x800);
    for (uVar10 = 0; uVar10 != uVar6; uVar10 = uVar10 + 1) {
      for (pbVar7 = local_258; pbVar7 != local_258 + local_250; pbVar7 = pbVar7 + 1) {
        bVar2 = *pbVar7;
        lVar4 = -6;
        puVar9 = local_278;
        do {
          lVar4 = lVar4 + 6;
          uVar3 = *puVar9;
          puVar9 = puVar9 + 1;
        } while (uVar3 != (local_278[uVar10] * 2 + 1 & nfa[bVar2]));
        uVar8 = lVar4 << ((char)uVar10 * '\x06' & 0x3fU);
        __s[bVar2] = __s[bVar2] | uVar8;
        if ((byte)(bVar2 + 0x9f) < 0x1a) {
          __s[(ulong)bVar2 - 0x20] = __s[(ulong)bVar2 - 0x20] | uVar8;
        }
      }
    }
    for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
      __s[lVar4] = __s[lVar4] | 0xd80000000000000;
    }
    (this->field_11).prefix_dfa_ = __s;
    uStack_280 = 0x41ccaa;
    std::__cxx11::string::~string((string *)&local_258);
  }
  return;
}

Assistant:

void Prog::ConfigurePrefixAccel(const std::string& prefix,
                                bool prefix_foldcase) {
  prefix_foldcase_ = prefix_foldcase;
  prefix_size_ = prefix.size();
  if (prefix_foldcase_) {
    // Use PrefixAccel_ShiftDFA().
    // ... and no more than nine bytes of the prefix. (See above for details.)
    prefix_size_ = std::min(prefix_size_, kShiftDFAFinal);
    prefix_dfa_ = BuildShiftDFA(prefix.substr(0, prefix_size_));
  } else if (prefix_size_ != 1) {
    // Use PrefixAccel_FrontAndBack().
    prefix_front_back.prefix_front_ = prefix.front();
	prefix_front_back.prefix_back_ = prefix.back();
  } else {
    // Use memchr(3).
	prefix_front_back.prefix_front_ = prefix.front();
  }
}